

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Resize(ResizeForm4 Resize)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  bool bVar8;
  reference pvVar9;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiHeight;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  uint8_t in_stack_fffffffffffffda6;
  uint8_t in_stack_fffffffffffffda7;
  uint32_t in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  value_type vVar10;
  undefined4 in_stack_fffffffffffffdb4;
  Image *in_stack_fffffffffffffdb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdc0;
  uint32_t in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  uint8_t uVar11;
  size_type sVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Image *image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  undefined1 local_130 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0 [2];
  undefined1 local_b0 [96];
  undefined1 local_50 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  uVar11 = (uint8_t)((uint)in_stack_fffffffffffffdcc >> 0x18);
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd9c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffdac
             ,in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            (uVar11,in_stack_fffffffffffffdc8,(uint32_t)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
             in_stack_fffffffffffffdb8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dff5e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffdac
             ,in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,in_stack_fffffffffffffda6);
  Test_Helper::uniformImage
            (uVar11,in_stack_fffffffffffffdc8,(uint32_t)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
             in_stack_fffffffffffffdb8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dffc7);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1dffdc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e0005);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e001a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e0043);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e0058);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e0081);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e0096);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e00bf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_f0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_130 + 0x20),0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,0);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffda7,
                      CONCAT16(in_stack_fffffffffffffda6,
                               CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (uint32_t *)0x1e0157);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_f0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_130 + 0x20),1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,1);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffda7,
                      CONCAT16(in_stack_fffffffffffffda6,
                               CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (uint32_t *)0x1e01f2);
  sVar12 = 0;
  this = local_f0;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,0);
  vVar1 = *pvVar9;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_130 + 0x20);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar12);
  vVar2 = *pvVar9;
  image = (Image *)local_130;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)image,sVar12);
  vVar3 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,sVar12);
  uVar11 = (uint8_t)(sVar12 >> 0x38);
  vVar4 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,1);
  vVar5 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,1);
  vVar6 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)image,1);
  vVar7 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,1);
  vVar10 = *pvVar9;
  (*local_10)(local_50,vVar1,vVar2,vVar3,vVar4,local_b0,vVar5,vVar6,vVar7);
  sVar12 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_f0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_130 + 0x20),sVar12);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,sVar12);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_150,sVar12);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  bVar8 = Unit_Test::verifyImage
                    (image,(uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,
                     (uint32_t)((ulong)this >> 0x20),(uint32_t)this,uVar11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,vVar10));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,vVar10));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,vVar10));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,vVar10));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0424);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0431);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,vVar10));
  return bVar8;
}

Assistant:

bool form4_Resize(ResizeForm4 Resize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage( intensity[1] );

        std::vector < uint32_t > roiX( 2 ), roiY( 2 ), roiWidth( 2 ), roiHeight( 2 );

        generateRoi( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0] );
        generateRoi( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        Resize( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0], output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        return verifyImage( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1], intensity[0] );
    }